

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O0

bool __thiscall
GmmLib::GmmTextureCalc::RedescribeTexturePlanes
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t *pWidthBytesPhysical)

{
  GMM_RESOURCE_FORMAT GVar1;
  bool bVar2;
  uint8_t uVar3;
  GMM_PLATFORM_INFO *pGVar4;
  long in_FS_OFFSET;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_STATUS Status;
  uint32_t *pWidthBytesPhysical_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  GMM_TEXTURE_INFO TexInfoUVPlane;
  
  TexInfoUVPlane._512_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  pGVar4 = GmmGetPlatformInfo(this->pGmmLibContext);
  memcpy(&this_local,pTexInfo,0x208);
  memcpy(&this_local,pTexInfo,0x208);
  uVar3 = GmmIsUVPacked(pTexInfo->Format);
  if (uVar3 != '\0') {
    GVar1 = pTexInfo->Format;
    if (GVar1 - GMM_FORMAT_NV12 < 2) {
LAB_0028d9e4:
      TexInfoUVPlane.Type = RESOURCE_HW_CONTEXT;
    }
    else {
      if (2 < GVar1 - GMM_FORMAT_P010) {
        if (GVar1 == GMM_FORMAT_P208) goto LAB_0028d9e4;
        if (GVar1 != GMM_FORMAT_P216) {
          bVar2 = true;
          goto LAB_0028da9b;
        }
      }
      TexInfoUVPlane.Type = 0x20;
    }
  }
  SetTileMode(this,(GMM_TEXTURE_INFO *)&this_local);
  *pWidthBytesPhysical =
       (*pWidthBytesPhysical +
       (pGVar4->TileInfo[TexInfoUVPlane.OffsetInfo.field_0.Plane.NoOfPlanes].LogicalTileWidth - 1))
       - (*pWidthBytesPhysical +
          (pGVar4->TileInfo[TexInfoUVPlane.OffsetInfo.field_0.Plane.NoOfPlanes].LogicalTileWidth - 1
          ) & pGVar4->TileInfo[TexInfoUVPlane.OffsetInfo.field_0.Plane.NoOfPlanes].LogicalTileWidth
              - 1);
LAB_0028da9b:
  if (*(long *)(in_FS_OFFSET + 0x28) != TexInfoUVPlane._512_8_) {
    __stack_chk_fail();
  }
  return (bool)(-!bVar2 & 1);
}

Assistant:

bool GmmLib::GmmTextureCalc::RedescribeTexturePlanes(GMM_TEXTURE_INFO *pTexInfo, uint32_t *pWidthBytesPhysical)
{
    GMM_STATUS               Status = GMM_SUCCESS;
    GMM_TEXTURE_INFO         TexInfoUVPlane;
    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    __GMM_ASSERT(pTexInfo);
    __GMM_ASSERT(pTexInfo->Flags.Info.RedecribedPlanes);
    __GMM_ASSERT(pWidthBytesPhysical);

    TexInfoUVPlane = *pTexInfo;
#ifdef _WIN32
    memcpy_s(&TexInfoUVPlane, sizeof(GMM_TEXTURE_INFO), pTexInfo, sizeof(GMM_TEXTURE_INFO));
#else
    memcpy(&TexInfoUVPlane, pTexInfo, sizeof(GMM_TEXTURE_INFO));
#endif // _WIN32


    if(GmmIsUVPacked(pTexInfo->Format))
    {
        // UV packed resources must have two seperate
        // tiling modes per plane, due to the packed
        // UV plane having twice the bits per pixel
        // as the Y plane.
        switch(pTexInfo->Format)
        {
            case GMM_FORMAT_NV12:
            case GMM_FORMAT_NV21:
            case GMM_FORMAT_P208:
                TexInfoUVPlane.BitsPerPixel = 16; // Redescribe bpp to 16 from 8
                break;
            case GMM_FORMAT_P010:
            case GMM_FORMAT_P012:
            case GMM_FORMAT_P016:
            case GMM_FORMAT_P216:
                TexInfoUVPlane.BitsPerPixel = 32;
                break;
            default:
                GMM_ASSERTDPF(0, "Unsupported format/pixel size combo!");
                Status = GMM_INVALIDPARAM;
                goto ERROR_CASE;
                break;
        }
    }
    else
    {
        // Non-UV packed surfaces, TileMode and bpp of each plane is same as that of pTexInfo
    }

    SetTileMode(&TexInfoUVPlane);
    *pWidthBytesPhysical = GFX_ALIGN(*pWidthBytesPhysical, pPlatform->TileInfo[TexInfoUVPlane.TileMode].LogicalTileWidth);

ERROR_CASE:
    return (Status == GMM_SUCCESS) ? true : false;
}